

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O2

void __thiscall
deqp::sl::ShaderParser::ShaderParser
          (ShaderParser *this,TestContext *testCtx,RenderContext *renderCtx)

{
  this->m_testCtx = testCtx;
  this->m_renderCtx = renderCtx;
  (this->m_input)._M_dataplus._M_p = (pointer)&(this->m_input).field_2;
  (this->m_input)._M_string_length = 0;
  (this->m_input).field_2._M_local_buf[0] = '\0';
  this->m_curPtr = (char *)0x0;
  this->m_curToken = TOKEN_LAST;
  (this->m_curTokenStr)._M_dataplus._M_p = (pointer)&(this->m_curTokenStr).field_2;
  (this->m_curTokenStr)._M_string_length = 0;
  (this->m_curTokenStr).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

ShaderParser::ShaderParser(tcu::TestContext& testCtx, RenderContext& renderCtx)
	: m_testCtx(testCtx), m_renderCtx(renderCtx), m_curPtr(DE_NULL), m_curToken(TOKEN_LAST)
{
}